

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O1

void __thiscall ixy::IxgbeDevice::set_promisc(IxgbeDevice *this,bool enabled)

{
  uint uVar1;
  undefined7 in_register_00000031;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> LStack_18;
  
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    LStack_18.list.second = "disabling promisc mode";
    info<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0x19a,"set_promisc",&LStack_18);
    if (this->len - 4 < 0x5080) goto LAB_00107a0d;
    if (this->len - 4 < 0x5080) goto LAB_00107a2c;
    uVar1 = *(uint *)(this->addr + 0x5080) & 0xfffffcff;
  }
  else {
    LStack_18.list.second = "enabling promisc mode";
    info<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0x197,"set_promisc",&LStack_18);
    if (this->len - 4 < 0x5080) {
LAB_00107a0d:
      __assert_fail("reg <= len - 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                    ,0x1cb,"uint32_t ixy::IxgbeDevice::get_reg32(uint64_t)");
    }
    if (this->len - 4 < 0x5080) {
LAB_00107a2c:
      __assert_fail("reg <= len - 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                    ,0x1d2,"void ixy::IxgbeDevice::set_reg32(uint64_t, uint32_t)");
    }
    uVar1 = *(uint *)(this->addr + 0x5080) | 0x300;
  }
  *(uint *)(this->addr + 0x5080) = uVar1;
  return;
}

Assistant:

void IxgbeDevice::set_promisc(bool enabled) {
    if (enabled) {
        info("enabling promisc mode");
        set_flags32(IXGBE_FCTRL, IXGBE_FCTRL_MPE | IXGBE_FCTRL_UPE);
    } else {
        info("disabling promisc mode");
        clear_flags32(IXGBE_FCTRL, IXGBE_FCTRL_MPE | IXGBE_FCTRL_UPE);
    }
}